

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O2

vector<bool,_std::allocator<bool>_> * __thiscall
OpenMD::SelectionSet::none
          (vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,SelectionSet *this)

{
  bool bVar1;
  ulong *puVar2;
  ulong uVar3;
  long lVar4;
  int i;
  size_type __n;
  reference rVar5;
  allocator_type local_29;
  
  std::vector<bool,_std::allocator<bool>_>::vector(__return_storage_ptr__,6,&local_29);
  lVar4 = 0;
  for (__n = 0; __n != 6; __n = __n + 1) {
    bVar1 = OpenMDBitSet::none((OpenMDBitSet *)
                               ((long)&(((this->bitsets_).
                                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                                       super__Bvector_base<std::allocator<bool>_> + lVar4));
    rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](__return_storage_ptr__,__n);
    puVar2 = rVar5._M_p;
    if (bVar1) {
      uVar3 = rVar5._M_mask | *puVar2;
    }
    else {
      uVar3 = ~rVar5._M_mask & *puVar2;
    }
    *puVar2 = uVar3;
    lVar4 = lVar4 + 0x28;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<bool> SelectionSet::none() {
    std::vector<bool> result(N_SELECTIONTYPES);
    for (int i = 0; i < N_SELECTIONTYPES; i++)
      result[i] = bitsets_[i].none();
    return result;
  }